

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O1

QVariant * __thiscall
StringListModel::data
          (QVariant *__return_storage_ptr__,StringListModel *this,QModelIndex *index,int role)

{
  QVariant baseData;
  QArrayData *local_48;
  long local_38;
  QVariant local_30;
  
  QStringListModel::data((QModelIndex *)&local_30,(int)this);
  QVariant::toString();
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  if (local_38 == 0) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    QVariant::QVariant(__return_storage_ptr__,&local_30);
  }
  QVariant::~QVariant(&local_30);
  return __return_storage_ptr__;
}

Assistant:

QVariant data(const QModelIndex &index, int role = Qt::DisplayRole) const override
    {
        const QVariant baseData = QStringListModel::data(index, role);
        if (baseData.toString().isEmpty())
            return QVariant();
        return baseData;
    }